

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserUtils.cpp
# Opt level: O3

longlong GeneratedSaxParser::Utils::toInteger<long_long,true>(ParserChar *buffer,bool *failed)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  ParserChar *s;
  byte *pbVar5;
  byte bVar6;
  
  if ((buffer != (ParserChar *)0x0) && (bVar6 = *buffer, bVar6 != 0)) {
    pbVar5 = (byte *)(buffer + 1);
    do {
      uVar2 = (ulong)bVar6;
      if (0x2d < bVar6) {
LAB_0080cb25:
        pbVar5 = pbVar5 + -1;
LAB_0080cb28:
        lVar4 = 1;
LAB_0080cb2d:
        bVar6 = *pbVar5;
        if (bVar6 == 0) {
          lVar3 = 0;
          goto LAB_0080cb75;
        }
        bVar1 = bVar6 - 0x30;
        if (9 < bVar1) {
          lVar3 = 0;
          goto LAB_0080cb70;
        }
        lVar3 = 0;
        goto LAB_0080cb43;
      }
      if ((0x100002600U >> (uVar2 & 0x3f) & 1) == 0) {
        if (uVar2 == 0x2b) goto LAB_0080cb28;
        if (uVar2 != 0x2d) goto LAB_0080cb25;
        lVar4 = -1;
        goto LAB_0080cb2d;
      }
      bVar6 = *pbVar5;
      pbVar5 = pbVar5 + 1;
    } while (bVar6 != 0);
  }
  goto LAB_0080cb0a;
  while ((byte)(bVar6 - 0x30) < 10) {
LAB_0080cb43:
    pbVar5 = pbVar5 + 1;
    lVar3 = (ulong)bVar6 + lVar3 * 10 + -0x30;
    bVar6 = *pbVar5;
    if (bVar6 == 0) goto LAB_0080cb75;
  }
LAB_0080cb70:
  if (bVar1 < 10) {
LAB_0080cb75:
    *failed = false;
    return lVar3 * lVar4;
  }
LAB_0080cb0a:
  *failed = true;
  return 0;
}

Assistant:

IntegerType Utils::toInteger(const ParserChar* buffer, bool& failed)
	{
		const ParserChar* s = buffer;
		if ( !s )
		{
			failed = true;
			return 0;
		}

		if ( *s == '\0' )
		{
			failed = true;
			return 0;
		}

		// Skip leading white spaces
		while ( isWhiteSpace(*s) )
		{
			++s;
			if ( *s == '\0' )
			{
				failed = true;
				return 0;
			}
		}

		IntegerType value = 0;
		IntegerType sign = 1;
		if ( signedInteger )
		{
			if (*s == '-')
			{
				++s;
				sign = -1;
			}
			else if (*s == '+')
			{
				++s;
			}
		}

		bool digitFound = false;
		while (true)
		{
			if ( *s == '\0' )
			{
				failed = false;
				return value * sign;
			}

			if ( isdigit(*s) )
			{
				value = value * 10 + (*s - '0');
				digitFound = true;
			}
			else
			{
				break;
			}
			++s;
		}
		if ( digitFound )
		{
			failed = false;
			if ( signedInteger )
				return value * sign;
			else
				return value;
		}
		else
		{
			failed = true;
			return 0;
		}
	}